

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O3

int Cec_ManCheckNonTrivialCands(Gia_Man_t *pAig)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pGVar7;
  
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar5 = pAig->nRegs;
    pVVar4 = pAig->vCos;
    iVar6 = pVVar4->nSize;
    if (iVar5 < iVar6) {
      lVar2 = 0;
      do {
        if (iVar6 <= lVar2) goto LAB_00658b27;
        iVar6 = pVVar4->pArray[lVar2];
        if (((long)iVar6 < 0) || (pAig->nObjs <= iVar6)) goto LAB_00658b08;
        if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar7 = pAig->pObjs + iVar6;
        *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) =
             *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) | 0x40000000;
        lVar2 = lVar2 + 1;
        iVar5 = pAig->nRegs;
        pVVar4 = pAig->vCos;
        iVar6 = pVVar4->nSize;
      } while (lVar2 < iVar6 - iVar5);
    }
    iVar6 = 0;
    if ((0 < pAig->nObjs) && (pGVar7 = pAig->pObjs, pGVar7 != (Gia_Obj_t *)0x0)) {
      uVar3 = 0;
      do {
        uVar1 = *(uint *)pGVar7;
        if ((((uVar1 >> 0x1e & 1) == 0) &&
            ((~uVar1 & 0x9fffffff) == 0 || -1 < (int)uVar1 && (~uVar1 & 0x1fffffff) != 0)) &&
           ((~(uint)pAig->pReprs[uVar3] & 0xfffffff) != 0)) {
          iVar6 = 1;
          goto LAB_00658aa0;
        }
        uVar3 = uVar3 + 1;
        pGVar7 = pGVar7 + 1;
      } while ((uint)pAig->nObjs != uVar3);
      iVar6 = 0;
    }
LAB_00658aa0:
    uVar3 = (ulong)(uint)pVVar4->nSize;
    if (iVar5 < pVVar4->nSize) {
      lVar2 = 0;
      do {
        if ((int)uVar3 <= lVar2) {
LAB_00658b27:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar5 = pVVar4->pArray[lVar2];
        if (((long)iVar5 < 0) || (pAig->nObjs <= iVar5)) {
LAB_00658b08:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pAig->pObjs == (Gia_Obj_t *)0x0) {
          return iVar6;
        }
        pGVar7 = pAig->pObjs + iVar5;
        *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) =
             *(ulong *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)) &
             0xffffffffbfffffff;
        lVar2 = lVar2 + 1;
        pVVar4 = pAig->vCos;
        uVar3 = (ulong)pVVar4->nSize;
      } while (lVar2 < (long)(uVar3 - (long)pAig->nRegs));
    }
  }
  return iVar6;
}

Assistant:

int Cec_ManCheckNonTrivialCands( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i, RetValue = 0;
    if ( pAig->pReprs == NULL )
        return 0;
    // label internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // check if there are non-labled equivs
    Gia_ManForEachObj( pAig, pObj, i )
        if ( Gia_ObjIsCand(pObj) && !pObj->fMark0 && Gia_ObjRepr(pAig, i) != GIA_VOID )
        {
            RetValue = 1;
            break;
        }
    // clean internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;
    return RetValue;
}